

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O2

sunrealtype ** SUNDlsMat_newDenseMat(sunindextype m,sunindextype n)

{
  sunrealtype **__ptr;
  sunrealtype *psVar1;
  long lVar2;
  
  if ((0 < m && 0 < n) && (__ptr = (sunrealtype **)malloc(n * 8), __ptr != (sunrealtype **)0x0)) {
    psVar1 = (sunrealtype *)malloc(m * n * 8);
    *__ptr = psVar1;
    if (psVar1 != (sunrealtype *)0x0) {
      for (lVar2 = 1; psVar1 = psVar1 + m, n != lVar2; lVar2 = lVar2 + 1) {
        __ptr[lVar2] = psVar1;
      }
      return __ptr;
    }
    free(__ptr);
  }
  return (sunrealtype **)0x0;
}

Assistant:

sunrealtype** SUNDlsMat_newDenseMat(sunindextype m, sunindextype n)
{
  sunindextype j;
  sunrealtype** a;

  if ((n <= 0) || (m <= 0)) { return (NULL); }

  a = NULL;
  a = (sunrealtype**)malloc(n * sizeof(sunrealtype*));
  if (a == NULL) { return (NULL); }

  a[0] = NULL;
  a[0] = (sunrealtype*)malloc(m * n * sizeof(sunrealtype));
  if (a[0] == NULL)
  {
    free(a);
    a = NULL;
    return (NULL);
  }

  for (j = 1; j < n; j++) { a[j] = a[0] + j * m; }

  return (a);
}